

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O3

HashTable<1UL> * CalculateInThreads<2ul>(HashTable<1UL> *__return_storage_ptr__,Data *input)

{
  char cVar1;
  Data DVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  HashTable<1UL> *pHVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  pair<const_Key<2UL>,_unsigned_int> *j;
  Key<2UL> *k;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  thread threads [4];
  anon_class_16_2_28188355_for__M_head_impl invoke;
  uint local_15c;
  HashTable<1UL> *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>::iterator,_bool>
  local_120;
  undefined1 local_108 [24];
  size_t asStack_f0 [2];
  _Head_base<0UL,_unsigned_long,_false> local_e0 [20];
  anon_class_16_2_28188355_for__M_head_impl local_40;
  
  lVar9 = 0;
  do {
    *(undefined1 **)(local_108 + lVar9) =
         &phmap::priv::
          EmptyGroup<std::is_same<std::allocator<std::pair<Key<2ul>const,unsigned_int>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>>()
          ::empty_group;
    *(undefined8 *)((long)&local_e0[0]._M_head_impl + lVar9) = 0;
    *(undefined1 (*) [16])(local_108 + lVar9 + 8) = (undefined1  [16])0x0;
    *(undefined8 *)((long)asStack_f0 + lVar9) = 0;
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0xc0);
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_40.hash_tables = (HashTable<1UL> (*) [4])local_108;
  local_15c = 0;
  local_40.input = input;
  do {
    std::thread::
    thread<CalculateInThreads<2ul>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(unsigned_int)_1_&,unsigned_int&,void>
              ((thread *)&local_120,&local_40,&local_15c);
    if (*(long *)(local_148 + (ulong)local_15c * 8) != 0) goto LAB_00104230;
    *(ctrl_t **)(local_148 + (ulong)local_15c * 8) = local_120.first.ctrl_;
    local_15c = local_15c + 1;
  } while (local_15c < 4);
  lVar9 = 0;
  do {
    std::thread::join();
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x20);
  lVar9 = 1;
  local_158 = __return_storage_ptr__;
  do {
    pcVar3 = *(char **)(local_108 + lVar9 * 0x30);
    k = *(Key<2UL> **)(local_108 + lVar9 * 0x30 + 8);
    cVar1 = *pcVar3;
    pcVar12 = pcVar3;
    while (cVar1 < -1) {
      auVar13[0] = -(*pcVar12 < -1);
      auVar13[1] = -(pcVar12[1] < -1);
      auVar13[2] = -(pcVar12[2] < -1);
      auVar13[3] = -(pcVar12[3] < -1);
      auVar13[4] = -(pcVar12[4] < -1);
      auVar13[5] = -(pcVar12[5] < -1);
      auVar13[6] = -(pcVar12[6] < -1);
      auVar13[7] = -(pcVar12[7] < -1);
      auVar13[8] = -(pcVar12[8] < -1);
      auVar13[9] = -(pcVar12[9] < -1);
      auVar13[10] = -(pcVar12[10] < -1);
      auVar13[0xb] = -(pcVar12[0xb] < -1);
      auVar13[0xc] = -(pcVar12[0xc] < -1);
      auVar13[0xd] = -(pcVar12[0xd] < -1);
      auVar13[0xe] = -(pcVar12[0xe] < -1);
      auVar13[0xf] = -(pcVar12[0xf] < -1);
      uVar11 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar13[0xf] >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar10 = (ulong)uVar5;
      k = k + uVar10 * 2;
      cVar1 = pcVar12[uVar10];
      pcVar12 = pcVar12 + uVar10;
    }
    sVar4 = asStack_f0[lVar9 * 6];
    local_150 = lVar9;
    while (uVar8 = local_108._8_8_, uVar7 = local_108._0_8_, pHVar6 = local_158,
          pcVar12 != pcVar3 + sVar4) {
      DVar2 = k[1]._data;
      phmap::priv::
      raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<2ul>,unsigned_int>,Key<2ul>::Hash,phmap::EqualTo<Key<2ul>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>
      ::try_emplace_impl<Key<2ul>const&>(&local_120,local_108,k);
      *(int *)((long)local_120.first.field_1.slot_ + 4) =
           *(int *)((long)local_120.first.field_1.slot_ + 4) + DVar2;
      k = k + 2;
      cVar1 = pcVar12[1];
      pcVar12 = pcVar12 + 1;
      while (cVar1 < -1) {
        auVar14[0] = -(*pcVar12 < -1);
        auVar14[1] = -(pcVar12[1] < -1);
        auVar14[2] = -(pcVar12[2] < -1);
        auVar14[3] = -(pcVar12[3] < -1);
        auVar14[4] = -(pcVar12[4] < -1);
        auVar14[5] = -(pcVar12[5] < -1);
        auVar14[6] = -(pcVar12[6] < -1);
        auVar14[7] = -(pcVar12[7] < -1);
        auVar14[8] = -(pcVar12[8] < -1);
        auVar14[9] = -(pcVar12[9] < -1);
        auVar14[10] = -(pcVar12[10] < -1);
        auVar14[0xb] = -(pcVar12[0xb] < -1);
        auVar14[0xc] = -(pcVar12[0xc] < -1);
        auVar14[0xd] = -(pcVar12[0xd] < -1);
        auVar14[0xe] = -(pcVar12[0xe] < -1);
        auVar14[0xf] = -(pcVar12[0xf] < -1);
        uVar11 = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar14[0xf] >> 7) << 0xf) + 1;
        uVar5 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar10 = (ulong)uVar5;
        k = k + uVar10 * 2;
        cVar1 = pcVar12[uVar10];
        pcVar12 = pcVar12 + uVar10;
      }
    }
    lVar9 = local_150 + 1;
  } while (lVar9 != 4);
  local_108._0_8_ =
       &phmap::priv::
        EmptyGroup<std::is_same<std::allocator<std::pair<Key<2ul>const,unsigned_int>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>>()
        ::empty_group;
  local_108._8_8_ = (slot_type *)0x0;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .ctrl_ = (ctrl_t *)uVar7;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .slots_ = (slot_type *)uVar8;
  uVar7 = local_108._16_8_;
  sVar4 = asStack_f0[0];
  stack0xffffffffffffff08 = (undefined1  [16])0x0;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .size_ = uVar7;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .capacity_ = sVar4;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = local_e0[0]._M_head_impl;
  local_e0[0]._M_head_impl = 0;
  lVar9 = 0x20;
  while (*(long *)(local_148 + lVar9 + -8) == 0) {
    lVar9 = lVar9 + -8;
    if (lVar9 == 0) {
      lVar9 = 0x90;
      do {
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
        ::destroy_slots((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
                         *)(local_108 + lVar9));
        lVar9 = lVar9 + -0x30;
      } while (lVar9 != -0x30);
      return pHVar6;
    }
  }
LAB_00104230:
  std::terminate();
}

Assistant:

HashTable<size> CalculateInThreads(const Cfg::Data& input)
{
    HashTable<size> hash_tables[thread_count];
    std::thread threads[thread_count];

    auto invoke = [&](unsigned begin) {
        Calculate<size>(input, begin, hash_tables[begin]);
    };

    for(unsigned i = 0; i < thread_count; ++i)
        threads[i] = std::thread(invoke, i);

    for(auto& i : threads)
        i.join();

    auto& frequencies = hash_tables[0];
    for(unsigned i = 1 ; i < thread_count; ++i)
        for(auto& j : hash_tables[i])
            frequencies[j.first] += j.second;

    // return the 'frequency' by move instead of copy.
    return std::move(frequencies);
}